

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::ByteSizeLong
          (BiDirectionalLSTMLayerParams *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ActivationParams *pAVar4;
  size_t sVar5;
  LSTMWeightParams *value;
  uint64 uVar6;
  uint local_30;
  int cached_size;
  uint i_2;
  uint count_2;
  uint i_1;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  BiDirectionalLSTMLayerParams *this_local;
  
  uVar2 = activationsforwardlstm_size(this);
  _i = (size_t)uVar2;
  for (i_1 = 0; i_1 < uVar2; i_1 = i_1 + 1) {
    pAVar4 = activationsforwardlstm(this,i_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(pAVar4);
    _i = sVar5 + _i;
  }
  uVar2 = activationsbackwardlstm_size(this);
  _i = uVar2 + _i;
  for (i_2 = 0; i_2 < uVar2; i_2 = i_2 + 1) {
    pAVar4 = activationsbackwardlstm(this,i_2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(pAVar4);
    _i = sVar5 + _i;
  }
  uVar2 = weightparams_size(this);
  _i = (ulong)uVar2 * 2 + _i;
  for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
    value = weightparams(this,local_30);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::LSTMWeightParams>(value);
    _i = sVar5 + _i;
  }
  bVar1 = has_params(this);
  if (bVar1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::LSTMParams>(this->params_);
    _i = sVar5 + 1 + _i;
  }
  uVar6 = inputvectorsize(this);
  if (uVar6 != 0) {
    uVar6 = inputvectorsize(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  uVar6 = outputvectorsize(this);
  if (uVar6 != 0) {
    uVar6 = outputvectorsize(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t BiDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  {
    unsigned int count = this->activationsforwardlstm_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activationsforwardlstm(i));
    }
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  {
    unsigned int count = this->activationsbackwardlstm_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activationsbackwardlstm(i));
    }
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  {
    unsigned int count = this->weightparams_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weightparams(i));
    }
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->has_params()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->params_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}